

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-parser.h
# Opt level: O0

int ORPG::Core::getopt_internal(int argc,char **argv,char *options)

{
  char cVar1;
  FILE *pFVar2;
  int iVar3;
  char *pcVar4;
  char *olli;
  char *options_local;
  char **argv_local;
  int argc_local;
  
  if (optreset == 0) {
    if (*getopt_internal::place != '\0') goto LAB_0010684c;
  }
  else {
    nonopt_end = -1;
    nonopt_start = -1;
  }
  optreset = 0;
  if (argc <= optind) {
    getopt_internal::place = "";
    if (nonopt_end == -1) {
      if (nonopt_start != -1) {
        optind = nonopt_start;
      }
    }
    else {
      permute_args(nonopt_start,nonopt_end,optind,argv);
      optind = optind - (nonopt_end - nonopt_start);
    }
    nonopt_end = 0xffffffff;
    nonopt_start = 0xffffffff;
    return -1;
  }
  getopt_internal::place = argv[optind];
  if ((*getopt_internal::place != '-') ||
     ((getopt_internal::place[1] == '\0' && (pcVar4 = strchr(options,0x2d), pcVar4 == (char *)0x0)))
     ) {
    getopt_internal::place = "";
    if (nonopt_start == -1) {
      nonopt_start = optind;
    }
    else if (nonopt_end != -1) {
      permute_args(nonopt_start,nonopt_end,optind,argv);
      nonopt_start = optind - (nonopt_end - nonopt_start);
      nonopt_end = -1;
    }
    optind = optind + 1;
    iVar3 = getopt_internal(argc,argv,options);
    return iVar3;
  }
  if ((nonopt_start != -1) && (nonopt_end == -1)) {
    nonopt_end = optind;
  }
  pcVar4 = getopt_internal::place;
  if (((getopt_internal::place[1] != '\0') &&
      (pcVar4 = getopt_internal::place + 1, getopt_internal::place[1] == '-')) &&
     (getopt_internal::place[2] == '\0')) {
    optind = optind + 1;
    getopt_internal::place = "";
    if (nonopt_end != -1) {
      permute_args(nonopt_start,nonopt_end,optind,argv);
      optind = optind - (nonopt_end - nonopt_start);
    }
    nonopt_end = 0xffffffff;
    nonopt_start = 0xffffffff;
    return -1;
  }
  getopt_internal::place = pcVar4;
  if ((getopt_internal::place[1] != '\0') &&
     (cVar1 = *getopt_internal::place, getopt_internal::place = getopt_internal::place + 1,
     cVar1 == '-')) {
    getopt_internal::place = "";
    return -2;
  }
LAB_0010684c:
  pcVar4 = getopt_internal::place + 1;
  optopt = (uint)*getopt_internal::place;
  getopt_internal::place = pcVar4;
  if ((optopt == 0x3a) || (pcVar4 = strchr(options,optopt), pFVar2 = _stderr, pcVar4 == (char *)0x0)
     ) {
    pFVar2 = _stderr;
    if (optopt == 0x2d) {
      argv_local._4_4_ = 0xffffffff;
    }
    else {
      if (*getopt_internal::place == '\0') {
        optind = optind + 1;
      }
      if ((opterr != 0) && (*options != ':')) {
        pcVar4 = program_name(*argv);
        fprintf(pFVar2,"%s: illegal option -- %c%s\n",pcVar4,(ulong)optopt,getopt_internal::place);
      }
      argv_local._4_4_ = 0x3f;
    }
  }
  else {
    if (pcVar4[1] == ':') {
      if (*getopt_internal::place == '\0') {
        optind = optind + 1;
        if (argc <= optind) {
          getopt_internal::place = "";
          if ((opterr != 0) && (*options != ':')) {
            pcVar4 = program_name(*argv);
            fprintf(pFVar2,"%s: option requires an argument -- %c\n",pcVar4,(ulong)optopt);
          }
          return 0x3a;
        }
        optarg = argv[optind];
      }
      else {
        optarg = getopt_internal::place;
      }
      getopt_internal::place = "";
      optind = optind + 1;
    }
    else {
      optarg = (char *)0x0;
      if (*getopt_internal::place == '\0') {
        optind = optind + 1;
      }
    }
    argv_local._4_4_ = optopt;
  }
  return argv_local._4_4_;
}

Assistant:

int getopt_internal(int argc,
                            char* argv[],
                            const char *options) {
            /* option letter processing */
            static char* place = EMPTY;

            /* option letter list index */
            char* olli;

            /* reset our non-option start and end positions */
            if (optreset)
                nonopt_start = nonopt_end = -1;

            /* update scanning pointer */
            if (optreset || !*place) {
                optreset = 0;

                /* end of argument array */
                if (optind >= argc) {
                    place = EMPTY;

                    if (nonopt_end != -1) {
                        /* do permutation, if we have to
                        TODO: get this working!! */
                        permute_args(nonopt_start, nonopt_end, optind, argv);

                        optind -= nonopt_end - nonopt_start;
                    } else if (nonopt_start != -1) {
                        /* If we skipped non-options, set optind
                        to the first of them. */
                        optind = nonopt_start;
                    }

                    nonopt_start = nonopt_end = -1;

                    return EOF;
                }

                /* check if this is a non-option */
                if(*(place = argv[optind]) != OP_DELIM ||
                (place[1] == '\0' && strchr(options, '-') == NULL)) {
                    place = EMPTY;

                    /* if we found the first non-argument set, then start there
                    otherwise if we found the last non-argument then do a
                    permutation

                    TODO: Get this working!!! */
                    if (nonopt_start == -1)
                        nonopt_start = optind;
                    else if (nonopt_end != -1) {
                        permute_args(nonopt_start, nonopt_end, optind, argv);

                        nonopt_start = optind - (nonopt_end - nonopt_start);
                        nonopt_end = -1;
                    }

                    optind++;

                    return getopt_internal(argc, argv, options);
                }

                if (nonopt_start != -1 && nonopt_end == -1)
                    nonopt_end = optind;

                /* If we have "-" do nothing, if "--" we are done */
                if (place[1] != '\0' && *++place == '-' && place[1] == '\0') {
                    optind++;
                    place = EMPTY;
                    /* We found a long option (--), so if we skipped
                    non-options, we have to permute. */
                    if (nonopt_end != -1) {
                        permute_args(nonopt_start, nonopt_end, optind, argv);
                        optind -= nonopt_end - nonopt_start;
                    }

                    nonopt_start = nonopt_end = -1;

                    return -1;
                }

                /* found "--" */
                if (place[1] && *place++ == OP_DELIM) {
                    /* ++optind; */
                    place = EMPTY;

                    return CONTINUE_CODE;
                }
            }

            /* option letter okay? */
            if ((optopt = (int)*place++) == BADARG ||
                !(olli = (char *)strchr(options, optopt))) {
                /*
                * if the user didn't specify OP_DELIM as an option,
                * assume it means EOF.
                */
                if (optopt == (int)OP_DELIM)
                    return EOF;
                if (!*place)
                    ++optind;
                if (opterr && *options != ':')
                    (void)fprintf(stderr,
                                "%s: illegal option -- %c%s\n",
                                program_name(argv[0]), optopt, place);

                return BADCHAR;
            }
            if (*++olli != ':') {
                /* don't need argument */
                optarg = NULL;
                if (!*place)
                    ++optind;
            } else {
                /* need an argument */

                /* no white space */
                if (*place)
                    optarg = place;
                /* no arg */
                else if (argc <= ++optind) {
                    place = EMPTY;
                    if ((opterr) && (*options != ':'))
                        (void)fprintf(stderr,
                                    "%s: option requires an argument -- %c\n",
                                    program_name(argv[0]), optopt);
                    return BADARG;
                } else
                    /* white space */
                    optarg = argv[optind];

                place = EMPTY;
                ++optind;
            }

            /* dump back option letter */
            return optopt;
        }